

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  long lVar1;
  long lVar2;
  Function *args_2;
  FunctionCall *pFVar3;
  long lVar4;
  Module *local_40;
  Function *local_38;
  
  this_00 = this->module;
  local_38 = *(Function **)(__fn + 0x20);
  cloneExpressionPtr((Inliner *)&stack0xffffffffffffffc0,(pool_ptr<soul::heart::Expression> *)this);
  args_2 = pool_ptr<soul::heart::Function>::operator*
                     ((pool_ptr<soul::heart::Function> *)(__fn + 0x28));
  pFVar3 = Module::
           allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
                     (this_00,(CodeLocation *)(__fn + 8),
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffc0,args_2);
  lVar1 = *(long *)(__fn + 0x30);
  lVar2 = *(long *)(__fn + 0x38);
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_40 = (Module *)cloneExpression(this,*(Expression **)(lVar1 + lVar4));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&pFVar3->arguments,(pool_ref<soul::heart::Expression> *)&stack0xffffffffffffffc0);
  }
  return (int)pFVar3;
}

Assistant:

heart::FunctionCall& clone (const heart::FunctionCall& old)
        {
            auto& fc = module.allocate<heart::FunctionCall> (old.location, cloneExpressionPtr (old.target), old.getFunction());

            for (auto& arg : old.arguments)
                fc.arguments.push_back (cloneExpression (arg));

            return fc;
        }